

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void av1_change_config(AV1_COMP *cpi,AV1EncoderConfig *oxcf,_Bool is_sb_size_changed)

{
  uint32_t *puVar1;
  int iVar2;
  int iVar3;
  SequenceHeader *pSVar4;
  SequenceHeader *pSVar5;
  FIRSTPASS_STATS *pFVar6;
  aom_internal_error_info *info;
  MvCosts *pMVar7;
  long lVar8;
  LAYER_CONTEXT *pLVar9;
  int64_t iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  AV1_COMMON *cm;
  int i_2;
  int iVar14;
  aom_superres_mode aVar15;
  int iVar16;
  AV1LevelInfo *pAVar17;
  long lVar18;
  PALETTE_BUFFER *pPVar19;
  CONV_BUF_TYPE *pCVar20;
  uint8_t *puVar21;
  int16_t *piVar22;
  int8_t *piVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  AV1_PRIMARY *pAVar28;
  int i;
  long lVar29;
  int i_1;
  int sl;
  size_t num;
  double dVar30;
  undefined1 auVar31 [16];
  int max_tiles;
  ThreadData_conflict *local_48;
  AV1_COMMON *local_40;
  int max_tile_cols;
  
  pSVar4 = (cpi->common).seq_params;
  pAVar28 = cpi->ppi;
  iVar14 = -1;
  if ((pAVar28->lap_enabled != 0) && (cpi->compressor_stage == '\x01')) {
    iVar14 = (cpi->oxcf).gf_cfg.lag_in_frames;
  }
  local_40 = &cpi->common;
  local_48 = &cpi->td;
  memcpy(&cpi->oxcf,oxcf,0x480);
  av1_update_film_grain_parameters(cpi,oxcf);
  aVar15 = (oxcf->superres_cfg).superres_mode;
  if (aVar15 == AOM_SUPERRES_AUTO) {
    aVar15 = AOM_SUPERRES_NONE;
  }
  cpi->superres_mode = aVar15;
  (cpi->td).mb.e_mbd.bd = pSVar4->bit_depth;
  (cpi->td).mb.e_mbd.global_motion = (cpi->common).global_motion;
  uVar11 = *(undefined8 *)(cpi->oxcf).target_seq_level_idx;
  uVar12 = *(undefined8 *)((cpi->oxcf).target_seq_level_idx + 8);
  uVar13 = *(undefined8 *)((cpi->oxcf).target_seq_level_idx + 0x18);
  *(undefined8 *)((pAVar28->level_params).target_seq_level_idx + 0x10) =
       *(undefined8 *)((cpi->oxcf).target_seq_level_idx + 0x10);
  *(undefined8 *)((pAVar28->level_params).target_seq_level_idx + 0x18) = uVar13;
  *(undefined8 *)(pAVar28->level_params).target_seq_level_idx = uVar11;
  *(undefined8 *)((pAVar28->level_params).target_seq_level_idx + 8) = uVar12;
  (pAVar28->level_params).keep_level_stats = 0;
  for (lVar29 = 0; lVar29 != 0x20; lVar29 = lVar29 + 1) {
    bVar24 = (pAVar28->level_params).target_seq_level_idx[lVar29];
    if ((bVar24 < 0x1c || bVar24 == 0x20) &&
       (puVar1 = &(pAVar28->level_params).keep_level_stats,
       *puVar1 = *puVar1 | 1 << ((byte)lVar29 & 0x1f),
       (pAVar28->level_params).level_info[lVar29] == (AV1LevelInfo *)0x0)) {
      pAVar17 = (AV1LevelInfo *)aom_calloc(1,0x107d0);
      (pAVar28->level_params).level_info[lVar29] = pAVar17;
      if (pAVar17 == (AV1LevelInfo *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate level_params->level_info[i]");
      }
    }
  }
  bVar24 = (pAVar28->level_params).target_seq_level_idx[0];
  if (bVar24 < 0x1c) {
    pSVar5 = (cpi->common).seq_params;
    uVar27 = (uint)pSVar4->tier[0];
    dVar30 = av1_get_max_bitrate_for_level(bVar24,uVar27,pSVar5->profile);
    lVar29 = (cpi->oxcf).rc_cfg.target_bandwidth;
    lVar18 = (long)(dVar30 * 0.7);
    if (lVar29 < (long)(dVar30 * 0.7)) {
      lVar18 = lVar29;
    }
    (cpi->oxcf).rc_cfg.target_bandwidth = lVar18;
    pFVar6 = ((cpi->ppi->twopass).stats_buf_ctx)->total_stats;
    if (pFVar6 != (FIRSTPASS_STATS *)0x0) {
      (cpi->ppi->twopass).bits_left = (long)(((double)lVar18 * pFVar6->duration) / 10000000.0);
    }
    (cpi->oxcf).rc_cfg.over_shoot_pct = 0;
    (cpi->oxcf).rc_cfg.worst_allowed_q = 0xff;
    av1_get_max_tiles_for_level(bVar24,&max_tiles,&max_tile_cols);
    iVar25 = (cpi->oxcf).tile_cfg.tile_columns;
    while ((iVar16 = 1 << ((byte)iVar25 & 0x1f), 0 < iVar25 && (max_tile_cols < iVar16))) {
      iVar25 = iVar25 + -1;
      (cpi->oxcf).tile_cfg.tile_columns = iVar25;
    }
    iVar25 = (cpi->oxcf).tile_cfg.tile_rows;
    while ((0 < iVar25 && (max_tiles < iVar16 << ((byte)iVar25 & 0x1f)))) {
      iVar25 = iVar25 + -1;
      (cpi->oxcf).tile_cfg.tile_rows = iVar25;
    }
    dVar30 = av1_get_min_cr_for_level(bVar24,uVar27,(uint)pSVar5->still_picture);
    uVar27 = (cpi->oxcf).rc_cfg.min_cr;
    uVar26 = (uint)(long)(dVar30 * 100.0);
    if (uVar26 < uVar27) {
      uVar26 = uVar27;
    }
    (cpi->oxcf).rc_cfg.min_cr = uVar26;
  }
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     ((oxcf->rc_cfg).mode == AOM_Q)) {
    iVar25 = 0x10;
  }
  else {
    iVar16 = is_one_pass_rt_params(cpi);
    iVar25 = 0x12;
    if ((iVar16 != 0) && ((cpi->common).current_frame.frame_number != 0)) goto LAB_0019aad4;
  }
  (pAVar28->p_rc).baseline_gf_interval = iVar25;
LAB_0019aad4:
  (cpi->refresh_frame).golden_frame = false;
  (cpi->refresh_frame).bwd_ref_frame = false;
  bVar24 = 0;
  if ((oxcf->tile_cfg).enable_large_scale_tile == false) {
    bVar24 = (oxcf->tool_cfg).frame_parallel_decoding_mode ^ 1;
  }
  (cpi->common).features.refresh_frame_context = bVar24;
  if ((cpi->td).mb.palette_buffer == (PALETTE_BUFFER *)0x0) {
    pPVar19 = (PALETTE_BUFFER *)aom_memalign(0x10,0x5000);
    (cpi->td).mb.palette_buffer = pPVar19;
    if (pPVar19 == (PALETTE_BUFFER *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate x->palette_buffer");
    }
  }
  if ((cpi->td).mb.tmp_conv_dst == (CONV_BUF_TYPE *)0x0) {
    pCVar20 = (CONV_BUF_TYPE *)aom_memalign(0x20,0x8000);
    (cpi->td).mb.tmp_conv_dst = pCVar20;
    if (pCVar20 == (CONV_BUF_TYPE *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate x->tmp_conv_dst");
      pCVar20 = (cpi->td).mb.tmp_conv_dst;
    }
    (cpi->td).mb.e_mbd.tmp_conv_dst = pCVar20;
  }
  if ((cpi->oxcf).kf_cfg.key_freq_max != 0) {
    if ((cpi->td).mb.comp_rd_buffer.pred0 == (uint8_t *)0x0) {
      info = (cpi->common).error;
      puVar21 = (uint8_t *)aom_memalign(0x10,0x8000);
      (cpi->td).mb.comp_rd_buffer.pred0 = puVar21;
      if (puVar21 == (uint8_t *)0x0) {
        aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->pred0");
      }
      puVar21 = (uint8_t *)aom_memalign(0x10,0x8000);
      (cpi->td).mb.comp_rd_buffer.pred1 = puVar21;
      if (puVar21 == (uint8_t *)0x0) {
        aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->pred1");
      }
      piVar22 = (int16_t *)aom_memalign(0x20,0x8000);
      (cpi->td).mb.comp_rd_buffer.residual1 = piVar22;
      if (piVar22 == (int16_t *)0x0) {
        aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->residual1");
      }
      piVar22 = (int16_t *)aom_memalign(0x20,0x8000);
      (cpi->td).mb.comp_rd_buffer.diff10 = piVar22;
      if (piVar22 == (int16_t *)0x0) {
        aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->diff10");
      }
      puVar21 = (uint8_t *)aom_malloc(0x8000);
      (cpi->td).mb.comp_rd_buffer.tmp_best_mask_buf = puVar21;
      if (puVar21 == (uint8_t *)0x0) {
        aom_internal_error(info,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->tmp_best_mask_buf");
      }
    }
    for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
      if ((cpi->td).mb.tmp_pred_bufs[lVar29] == (uint8_t *)0x0) {
        puVar21 = (uint8_t *)aom_memalign(0x20,0x18000);
        (cpi->td).mb.tmp_pred_bufs[lVar29] = puVar21;
        if (puVar21 == (uint8_t *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate x->tmp_pred_bufs[i]");
          puVar21 = (cpi->td).mb.tmp_pred_bufs[lVar29];
        }
        (cpi->td).mb.e_mbd.tmp_obmc_bufs[lVar29] = puVar21;
      }
    }
  }
  cm = local_40;
  av1_reset_segment_features(local_40);
  pMVar7 = (cpi->td).mb.mv_costs;
  if (pMVar7 != (MvCosts *)0x0) {
    (cpi->common).features.allow_high_precision_mv = true;
    auVar31._8_4_ = (int)pMVar7;
    auVar31._0_8_ = pMVar7;
    auVar31._12_4_ = (int)((ulong)pMVar7 >> 0x20);
    pMVar7->nmv_cost_hp[0] = pMVar7->nmv_cost_hp_alloc[0] + 0x3fff;
    pMVar7->nmv_cost_hp[1] = (int *)(auVar31._8_8_ + 0x70000);
    pMVar7->nmv_cost[0] = pMVar7->nmv_cost_alloc[0] + 0x3fff;
    pMVar7->nmv_cost[1] = (int *)(auVar31._8_8_ + 0x30008);
    pMVar7->mv_cost_stack = pMVar7->nmv_cost_hp;
  }
  lVar29 = (pAVar28->p_rc).bits_off_target;
  lVar18 = (pAVar28->p_rc).maximum_buffer_size;
  lVar8 = (pAVar28->p_rc).buffer_level;
  if (lVar18 <= lVar29) {
    lVar29 = lVar18;
  }
  (pAVar28->p_rc).bits_off_target = lVar29;
  if (lVar8 < lVar18) {
    lVar18 = lVar8;
  }
  (pAVar28->p_rc).buffer_level = lVar18;
  av1_new_framerate(cpi,cpi->framerate);
  iVar25 = (oxcf->rc_cfg).best_allowed_q;
  (cpi->rc).worst_quality = (oxcf->rc_cfg).worst_allowed_q;
  (cpi->rc).best_quality = iVar25;
  if (((cpi->oxcf).rc_cfg.best_allowed_q == 0) && ((cpi->oxcf).rc_cfg.worst_allowed_q == 0)) {
    for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
      (pAVar28->p_rc).avg_frame_qindex[lVar29] = 0;
    }
  }
  (cpi->common).features.interp_filter = ((oxcf->tile_cfg).enable_large_scale_tile ^ 1U) << 2;
  (cpi->common).features.switchable_motion_mode =
       (_Bool)((oxcf->motion_mode_cfg).enable_obmc | (cpi->common).features.allow_warped_motion);
  iVar25 = (cpi->oxcf).frm_dim_cfg.render_width;
  if ((iVar25 < 1) || (iVar16 = (cpi->oxcf).frm_dim_cfg.render_height, iVar16 < 1)) {
    iVar16 = (cpi->oxcf).frm_dim_cfg.width;
    iVar25 = (cpi->oxcf).frm_dim_cfg.height;
    (cpi->common).render_width = iVar16;
    (cpi->common).render_height = iVar25;
  }
  else {
    (cpi->common).render_width = iVar25;
    (cpi->common).render_height = iVar16;
    iVar16 = (cpi->oxcf).frm_dim_cfg.width;
    iVar25 = (cpi->oxcf).frm_dim_cfg.height;
  }
  iVar2 = (cpi->common).width;
  iVar3 = (cpi->common).height;
  (cpi->common).width = iVar16;
  (cpi->common).height = iVar25;
  if ((cpi->data_alloc_width < iVar16) || (cpi->data_alloc_height < iVar25 || is_sb_size_changed)) {
    av1_free_context_buffers(cm);
    av1_free_shared_coeff_buffer(&(cpi->td).shared_coeff_buf);
    av1_free_sms_tree(local_48);
    av1_free_pmc((cpi->td).firstpass_ctx,
                 (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
    (cpi->td).firstpass_ctx = (PICK_MODE_CONTEXT *)0x0;
    alloc_compressor_data(cpi);
    realloc_segmentation_maps(cpi);
    iVar25 = (cpi->common).height;
    cpi->data_alloc_width = (cpi->common).width;
    cpi->data_alloc_height = iVar25;
    cpi->frame_size_related_setup_done = false;
  }
  av1_update_frame_size(cpi);
  if ((((cpi->common).width != iVar2) || ((cpi->common).height != iVar3)) &&
     ((cpi->oxcf).q_cfg.aq_mode == '\x03')) {
    num = (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows;
    aom_free(cpi->cyclic_refresh->map);
    piVar23 = (int8_t *)aom_calloc(num,1);
    cpi->cyclic_refresh->map = piVar23;
    if (piVar23 == (int8_t *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->cyclic_refresh->map");
    }
    iVar25 = (cpi->svc).number_spatial_layers;
    if (1 < iVar25) {
      for (iVar16 = 0; iVar16 < iVar25; iVar16 = iVar16 + 1) {
        lVar29 = (long)iVar16 * (long)(cpi->svc).number_temporal_layers;
        pLVar9 = (cpi->svc).layer_context;
        pLVar9[lVar29].sb_index = 0;
        pLVar9[lVar29].actual_num_seg1_blocks = 0;
        pLVar9[lVar29].actual_num_seg2_blocks = 0;
        pLVar9[lVar29].counter_encode_maxq_scene_change = 0;
        aom_free(pLVar9[lVar29].map);
        piVar23 = (int8_t *)aom_calloc(num,1);
        pLVar9[lVar29].map = piVar23;
        if (piVar23 == (int8_t *)0x0) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate lc->map");
        }
        iVar25 = (cpi->svc).number_spatial_layers;
      }
    }
  }
  (cpi->rc).is_src_frame_alt_ref = 0;
  pAVar28 = cpi->ppi;
  if ((pAVar28->rtc_ref).set_ref_frame_config == 0) {
    (cpi->ext_flags).refresh_frame.update_pending = false;
  }
  (cpi->ext_flags).refresh_frame_context_pending = false;
  if (pAVar28->use_svc != 0) {
    av1_update_layer_context_change_config(cpi,(oxcf->rc_cfg).target_bandwidth);
    pAVar28 = cpi->ppi;
  }
  if ((uint)(cpi->svc).number_spatial_layers < (cpi->common).current_frame.frame_number) {
    if (pAVar28->use_svc == 0) {
      iVar25 = (cpi->rc).avg_frame_bandwidth;
      iVar16 = (cpi->rc).prev_avg_frame_bandwidth >> 1;
      if (iVar16 < iVar25 / 3 || iVar25 < iVar16) {
        (cpi->rc).rc_1_frame = 0;
        (cpi->rc).rc_2_frame = 0;
        iVar10 = (pAVar28->p_rc).optimal_buffer_level;
        (pAVar28->p_rc).bits_off_target = iVar10;
        (pAVar28->p_rc).buffer_level = iVar10;
      }
    }
    else {
      av1_svc_check_reset_layer_rc_flag(cpi);
    }
  }
  if (iVar14 != -1) {
    (cpi->oxcf).gf_cfg.lag_in_frames = iVar14;
  }
  cpi->alloc_pyramid = (oxcf->tool_cfg).enable_global_motion;
  return;
}

Assistant:

void av1_change_config(struct AV1_COMP *cpi, const AV1EncoderConfig *oxcf,
                       bool is_sb_size_changed) {
  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  MACROBLOCK *const x = &cpi->td.mb;
  AV1LevelParams *const level_params = &cpi->ppi->level_params;
  RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const FrameDimensionCfg *const frm_dim_cfg = &cpi->oxcf.frm_dim_cfg;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  FeatureFlags *const features = &cm->features;

  // in case of LAP, lag in frames is set according to number of lap buffers
  // calculated at init time. This stores and restores LAP's lag in frames to
  // prevent override by new cfg.
  int lap_lag_in_frames = -1;
  if (cpi->ppi->lap_enabled && cpi->compressor_stage == LAP_STAGE) {
    lap_lag_in_frames = cpi->oxcf.gf_cfg.lag_in_frames;
  }

  cpi->oxcf = *oxcf;

#if !CONFIG_REALTIME_ONLY
  av1_update_film_grain_parameters(cpi, oxcf);
#endif

  // When user provides superres_mode = AOM_SUPERRES_AUTO, we still initialize
  // superres mode for current encoding = AOM_SUPERRES_NONE. This is to ensure
  // that any analysis (e.g. TPL) happening outside the main encoding loop still
  // happens at full resolution.
  // This value will later be set appropriately just before main encoding loop.
  cpi->superres_mode = oxcf->superres_cfg.superres_mode == AOM_SUPERRES_AUTO
                           ? AOM_SUPERRES_NONE
                           : oxcf->superres_cfg.superres_mode;  // default
  x->e_mbd.bd = (int)seq_params->bit_depth;
  x->e_mbd.global_motion = cm->global_motion;

  memcpy(level_params->target_seq_level_idx, cpi->oxcf.target_seq_level_idx,
         sizeof(level_params->target_seq_level_idx));
  level_params->keep_level_stats = 0;
  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    if (level_params->target_seq_level_idx[i] < SEQ_LEVELS ||
        level_params->target_seq_level_idx[i] == SEQ_LEVEL_KEEP_STATS) {
      level_params->keep_level_stats |= 1u << i;
      if (!level_params->level_info[i]) {
        CHECK_MEM_ERROR(cm, level_params->level_info[i],
                        aom_calloc(1, sizeof(*level_params->level_info[i])));
      }
    }
  }

  // TODO(huisu@): level targeting currently only works for the 0th operating
  // point, so scalable coding is not supported yet.
  if (level_params->target_seq_level_idx[0] < SEQ_LEVELS) {
    // Adjust encoder config in order to meet target level.
    config_target_level(cpi, level_params->target_seq_level_idx[0],
                        seq_params->tier[0]);
  }

  if (has_no_stats_stage(cpi) && (rc_cfg->mode == AOM_Q)) {
    p_rc->baseline_gf_interval = FIXED_GF_INTERVAL;
  } else if (!is_one_pass_rt_params(cpi) ||
             cm->current_frame.frame_number == 0) {
    // For rtc mode: logic for setting the baseline_gf_interval is done
    // in av1_get_one_pass_rt_params(), and it should not be reset here in
    // change_config(), unless after init_config (first frame).
    p_rc->baseline_gf_interval = (MIN_GF_INTERVAL + MAX_GF_INTERVAL) / 2;
  }

  refresh_frame->golden_frame = false;
  refresh_frame->bwd_ref_frame = false;

  features->refresh_frame_context =
      (oxcf->tool_cfg.frame_parallel_decoding_mode)
          ? REFRESH_FRAME_CONTEXT_DISABLED
          : REFRESH_FRAME_CONTEXT_BACKWARD;
  if (oxcf->tile_cfg.enable_large_scale_tile)
    features->refresh_frame_context = REFRESH_FRAME_CONTEXT_DISABLED;

  if (x->palette_buffer == NULL) {
    CHECK_MEM_ERROR(cm, x->palette_buffer,
                    aom_memalign(16, sizeof(*x->palette_buffer)));
  }

  if (x->tmp_conv_dst == NULL) {
    CHECK_MEM_ERROR(
        cm, x->tmp_conv_dst,
        aom_memalign(32, MAX_SB_SIZE * MAX_SB_SIZE * sizeof(*x->tmp_conv_dst)));
    x->e_mbd.tmp_conv_dst = x->tmp_conv_dst;
  }
  // The buffers 'tmp_pred_bufs[]' and 'comp_rd_buffer' are used in inter frames
  // to store intermediate inter mode prediction results and are not required
  // for allintra encoding mode. Hence, the memory allocations for these buffers
  // are avoided for allintra encoding mode.
  if (cpi->oxcf.kf_cfg.key_freq_max != 0) {
    if (x->comp_rd_buffer.pred0 == NULL)
      alloc_compound_type_rd_buffers(cm->error, &x->comp_rd_buffer);

    for (int i = 0; i < 2; ++i) {
      if (x->tmp_pred_bufs[i] == NULL) {
        CHECK_MEM_ERROR(cm, x->tmp_pred_bufs[i],
                        aom_memalign(32, 2 * MAX_MB_PLANE * MAX_SB_SQUARE *
                                             sizeof(*x->tmp_pred_bufs[i])));
        x->e_mbd.tmp_obmc_bufs[i] = x->tmp_pred_bufs[i];
      }
    }
  }

  av1_reset_segment_features(cm);

  av1_set_high_precision_mv(cpi, 1, 0);

  // Under a configuration change, where maximum_buffer_size may change,
  // keep buffer level clipped to the maximum allowed buffer size.
  p_rc->bits_off_target =
      AOMMIN(p_rc->bits_off_target, p_rc->maximum_buffer_size);
  p_rc->buffer_level = AOMMIN(p_rc->buffer_level, p_rc->maximum_buffer_size);

  // Set up frame rate and related parameters rate control values.
  av1_new_framerate(cpi, cpi->framerate);

  // Set absolute upper and lower quality limits
  rc->worst_quality = rc_cfg->worst_allowed_q;
  rc->best_quality = rc_cfg->best_allowed_q;

  // If lossless has been requested make sure average Q accumulators are reset.
  if (is_lossless_requested(&cpi->oxcf.rc_cfg)) {
    int i;
    for (i = 0; i < FRAME_TYPES; ++i) {
      p_rc->avg_frame_qindex[i] = 0;
    }
  }

  features->interp_filter =
      oxcf->tile_cfg.enable_large_scale_tile ? EIGHTTAP_REGULAR : SWITCHABLE;
  features->switchable_motion_mode = is_switchable_motion_mode_allowed(
      features->allow_warped_motion, oxcf->motion_mode_cfg.enable_obmc);

  if (frm_dim_cfg->render_width > 0 && frm_dim_cfg->render_height > 0) {
    cm->render_width = frm_dim_cfg->render_width;
    cm->render_height = frm_dim_cfg->render_height;
  } else {
    cm->render_width = frm_dim_cfg->width;
    cm->render_height = frm_dim_cfg->height;
  }

  int last_width = cm->width;
  int last_height = cm->height;
  cm->width = frm_dim_cfg->width;
  cm->height = frm_dim_cfg->height;

  if (cm->width > cpi->data_alloc_width ||
      cm->height > cpi->data_alloc_height || is_sb_size_changed) {
    av1_free_context_buffers(cm);
    av1_free_shared_coeff_buffer(&cpi->td.shared_coeff_buf);
    av1_free_sms_tree(&cpi->td);
    av1_free_pmc(cpi->td.firstpass_ctx, av1_num_planes(cm));
    cpi->td.firstpass_ctx = NULL;
    alloc_compressor_data(cpi);
    realloc_segmentation_maps(cpi);
    cpi->data_alloc_width = cm->width;
    cpi->data_alloc_height = cm->height;
    cpi->frame_size_related_setup_done = false;
  }
  av1_update_frame_size(cpi);

  if (cm->width != last_width || cm->height != last_height) {
    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ) {
      int mi_rows = cpi->common.mi_params.mi_rows;
      int mi_cols = cpi->common.mi_params.mi_cols;
      aom_free(cpi->cyclic_refresh->map);
      CHECK_MEM_ERROR(
          cm, cpi->cyclic_refresh->map,
          aom_calloc(mi_rows * mi_cols, sizeof(*cpi->cyclic_refresh->map)));
      if (cpi->svc.number_spatial_layers > 1) {
        for (int sl = 0; sl < cpi->svc.number_spatial_layers; ++sl) {
          const int layer =
              LAYER_IDS_TO_IDX(sl, 0, cpi->svc.number_temporal_layers);
          LAYER_CONTEXT *const lc = &cpi->svc.layer_context[layer];
          lc->sb_index = 0;
          lc->actual_num_seg1_blocks = 0;
          lc->actual_num_seg2_blocks = 0;
          lc->counter_encode_maxq_scene_change = 0;
          aom_free(lc->map);
          CHECK_MEM_ERROR(cm, lc->map,
                          aom_calloc(mi_rows * mi_cols, sizeof(*lc->map)));
        }
      }
    }
  }

  rc->is_src_frame_alt_ref = 0;

  if (!cpi->ppi->rtc_ref.set_ref_frame_config)
    cpi->ext_flags.refresh_frame.update_pending = 0;
  cpi->ext_flags.refresh_frame_context_pending = 0;

  if (cpi->ppi->use_svc)
    av1_update_layer_context_change_config(cpi, rc_cfg->target_bandwidth);

  check_reset_rc_flag(cpi);

  // restore the value of lag_in_frame for LAP stage.
  if (lap_lag_in_frames != -1) {
    cpi->oxcf.gf_cfg.lag_in_frames = lap_lag_in_frames;
  }

#if CONFIG_REALTIME_ONLY
  assert(!oxcf->tool_cfg.enable_global_motion);
  cpi->alloc_pyramid = false;
#else
  cpi->alloc_pyramid = oxcf->tool_cfg.enable_global_motion;
#endif  // CONFIG_REALTIME_ONLY
}